

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

value_type * __thiscall
llvm::
DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
::FindAndConstruct(DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
                   *this,DBKeyID *Key)

{
  bool bVar1;
  DenseMapPair<DBKeyID,_llbuild::core::KeyID> *TheBucket;
  DenseMapPair<DBKeyID,_llbuild::core::KeyID> *local_20;
  
  bVar1 = LookupBucketFor<DBKeyID>(this,Key,&local_20);
  if (!bVar1) {
    local_20 = DenseMapBase<llvm::DenseMap<DBKeyID,llbuild::core::KeyID,llvm::DenseMapInfo<DBKeyID>,llvm::detail::DenseMapPair<DBKeyID,llbuild::core::KeyID>>,DBKeyID,llbuild::core::KeyID,llvm::DenseMapInfo<DBKeyID>,llvm::detail::DenseMapPair<DBKeyID,llbuild::core::KeyID>>
               ::InsertIntoBucket<DBKeyID_const&>
                         ((DenseMapBase<llvm::DenseMap<DBKeyID,llbuild::core::KeyID,llvm::DenseMapInfo<DBKeyID>,llvm::detail::DenseMapPair<DBKeyID,llbuild::core::KeyID>>,DBKeyID,llbuild::core::KeyID,llvm::DenseMapInfo<DBKeyID>,llvm::detail::DenseMapPair<DBKeyID,llbuild::core::KeyID>>
                           *)this,local_20,Key);
  }
  return local_20;
}

Assistant:

value_type& FindAndConstruct(const KeyT &Key) {
    BucketT *TheBucket;
    if (LookupBucketFor(Key, TheBucket))
      return *TheBucket;

    return *InsertIntoBucket(TheBucket, Key);
  }